

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

bool __thiscall VCCluster::connected(VCCluster *this)

{
  size_type sVar1;
  size_type sVar2;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> c;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_00000070;
  VCFace *in_stack_00000078;
  VCCluster *in_stack_00000080;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *in_stack_ffffffffffffff88;
  undefined1 local_1;
  
  sVar1 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::size
                    ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e73c);
  if (sVar1 < 2) {
    local_1 = true;
  }
  else {
    std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::set
              ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e75b);
    std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::begin
              (in_stack_ffffffffffffff88);
    std::_Rb_tree_const_iterator<VCFace_*>::operator*((_Rb_tree_const_iterator<VCFace_*> *)0x27e778)
    ;
    bfs(in_stack_00000080,in_stack_00000078,in_stack_00000070,
        (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)this);
    sVar1 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::size
                      ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e79a);
    sVar2 = std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::size
                      ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e7ad);
    local_1 = sVar1 == sVar2;
    std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>::~set
              ((set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)0x27e7cb);
  }
  return local_1;
}

Assistant:

bool VCCluster::connected() {
	if (items.size() < 2) return true;
	set<VCFace*> c;
	bfs(*items.begin(), &c);
	return c.size() == items.size();
}